

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Environmental_Process_PDU::ClearEnvironmentRecords(Environmental_Process_PDU *this)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  pKVar1 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar3 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar3->_vptr_KRef_Ptr)(pKVar3);
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar2);
    (this->m_vEnvRecords).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  return;
}

Assistant:

void Environmental_Process_PDU::ClearEnvironmentRecords()
{
    // Reset the PDU length.
    m_ui16PDULength = ENVIROMENTAL_PROCESS_PDU_SIZE;
    m_vEnvRecords.clear();
}